

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigrp-packet.cc
# Opt level: O0

void __thiscall Ipv4InternalTlv::Print(Ipv4InternalTlv *this,ostream *os)

{
  ostream *poVar1;
  ostream *in_RSI;
  long in_RDI;
  uint32_t in_stack_0000006c;
  string local_60 [48];
  string local_30 [32];
  ostream *local_10;
  
  local_10 = in_RSI;
  poVar1 = std::operator<<(in_RSI,'\t');
  poVar1 = std::operator<<(poVar1,"Ipv4 Internal TLV:");
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(local_10,"\t\t");
  poVar1 = std::operator<<(poVar1,"type: ");
  poVar1 = std::operator<<(poVar1,"0x0102");
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(local_10,"\t\t");
  poVar1 = std::operator<<(poVar1,"length: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ushort *)(in_RDI + 10));
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(local_10,"\t\t");
  poVar1 = std::operator<<(poVar1,"nexthop: ");
  num2ip_abi_cxx11_(in_stack_0000006c);
  poVar1 = std::operator<<(poVar1,local_30);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string(local_30);
  poVar1 = std::operator<<(local_10,"\t\t");
  poVar1 = std::operator<<(poVar1,"prefix length: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*(byte *)(in_RDI + 0x30));
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(local_10,"\t\t");
  poVar1 = std::operator<<(poVar1,"destination: ");
  num2ip_abi_cxx11_(in_stack_0000006c);
  poVar1 = std::operator<<(poVar1,local_60);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string(local_60);
  poVar1 = std::operator<<(local_10,"\t\t");
  poVar1 = std::operator<<(poVar1,"metric:");
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(local_10,"\t\t\t");
  poVar1 = std::operator<<(poVar1,"scaled delay: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(in_RDI + 0x20));
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(local_10,"\t\t\t");
  poVar1 = std::operator<<(poVar1,"scaled bandwidth: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(in_RDI + 0x24));
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(local_10,"\t\t\t");
  poVar1 = std::operator<<(poVar1,"mtu: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(in_RDI + 0x28));
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(local_10,"\t\t\t");
  poVar1 = std::operator<<(poVar1,"hop count: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(in_RDI + 0x2c));
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void Ipv4InternalTlv::Print(std::ostream& os)
{
    os << '\t' << "Ipv4 Internal TLV:" << '\n';
    os << "\t\t"
       << "type: "
       << "0x0102" << '\n';
    os << "\t\t"
       << "length: " << tlen << '\n';
    os << "\t\t"
       << "nexthop: " << num2ip(nexthop) << '\n';
    os << "\t\t"
       << "prefix length: " << (uint32_t)prefixlen << '\n';
    os << "\t\t"
       << "destination: " << num2ip(destination) << '\n';
    os << "\t\t"
       << "metric:" << '\n';
    os << "\t\t\t"
       << "scaled delay: " << delay << '\n';
    os << "\t\t\t"
       << "scaled bandwidth: " << bandwidth << '\n';
    os << "\t\t\t"
       << "mtu: " << mtu << '\n';
    os << "\t\t\t"
       << "hop count: " << hop_count << '\n';
}